

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void CEditor::AddImage(char *pFileName,int StorageType,void *pUser)

{
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *this;
  long lVar1;
  int iVar2;
  CEditorImage *this_00;
  int i;
  long lVar3;
  long in_FS_OFFSET;
  CEditorImage *pImg;
  char aBuf [128];
  CEditorImage ImgInfo;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ImgInfo.m_Texture.m_Id = -1;
  ImgInfo.m_External = 0;
  ImgInfo.m_aName[0] = '\0';
  ImgInfo.super_CImageInfo.m_Width = 0;
  ImgInfo.super_CImageInfo.m_Height = 0;
  ImgInfo.super_CImageInfo.m_pData = (void *)0x0;
  ImgInfo.super_CImageInfo.m_Format = 0;
  ImgInfo.m_pAutoMapper = (IAutoMapper *)0x0;
  ImgInfo.m_pEditor = (CEditor *)pUser;
  iVar2 = (**(code **)(**(long **)((long)pUser + 0x30) + 0x70))
                    (*(long **)((long)pUser + 0x30),&ImgInfo,pFileName,StorageType);
  if (iVar2 != 0) {
    ExtractName(pFileName,aBuf,0x80);
    this = (array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)((long)pUser + 0x1260);
    lVar3 = 0;
    do {
      if (*(int *)((long)pUser + 0x126c) <= lVar3) {
        this_00 = (CEditorImage *)operator_new(0x1b0);
        CEditorImage::CEditorImage(this_00,(CEditor *)pUser);
        pImg = this_00;
        memcpy(this_00,&ImgInfo,0x1b0);
        iVar2 = (**(code **)(**(long **)((long)pUser + 0x30) + 0x80))
                          (*(long **)((long)pUser + 0x30),
                           ImgInfo.super_CImageInfo._0_8_ & 0xffffffff,
                           ImgInfo.super_CImageInfo.m_Height,ImgInfo.super_CImageInfo.m_Format,
                           ImgInfo.super_CImageInfo.m_pData,0xffffffffffffffff,8);
        ImgInfo.super_CImageInfo.m_pData = (void *)0x0;
        (this_00->m_Texture).m_Id = iVar2;
        this_00->m_External = 1;
        str_copy(this_00->m_aName,aBuf,0x80);
        CEditorImage::LoadAutoMapper(this_00);
        array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::add(this,&pImg);
        SortImages((CEditor *)pUser);
        if ((*(int *)((long)pUser + 0x10f0) < 0) ||
           (*(int *)((long)pUser + 0x126c) <= *(int *)((long)pUser + 0x10f0))) goto LAB_0018c199;
        lVar3 = 0;
        goto LAB_0018c16d;
      }
      iVar2 = str_comp(this->list[lVar3]->m_aName,aBuf);
      lVar3 = lVar3 + 1;
    } while (iVar2 != 0);
  }
  goto LAB_0018c1a0;
  while( true ) {
    iVar2 = str_comp(this->list[lVar3]->m_aName,aBuf);
    lVar3 = lVar3 + 1;
    if (iVar2 == 0) break;
LAB_0018c16d:
    if (*(int *)((long)pUser + 0x10f0) < lVar3) goto LAB_0018c199;
  }
  *(int *)((long)pUser + 0x10f0) = *(int *)((long)pUser + 0x10f0) + 1;
LAB_0018c199:
  *(undefined4 *)((long)pUser + 0x47c) = 0;
LAB_0018c1a0:
  CEditorImage::~CEditorImage(&ImgInfo);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::AddImage(const char *pFileName, int StorageType, void *pUser)
{
	CEditor *pEditor = (CEditor *)pUser;
	CEditorImage ImgInfo(pEditor);
	if(!pEditor->Graphics()->LoadPNG(&ImgInfo, pFileName, StorageType))
		return;

	// check if we have that image already
	char aBuf[128];
	ExtractName(pFileName, aBuf, sizeof(aBuf));
	for(int i = 0; i < pEditor->m_Map.m_lImages.size(); ++i)
	{
		if(!str_comp(pEditor->m_Map.m_lImages[i]->m_aName, aBuf))
			return;
	}

	CEditorImage *pImg = new CEditorImage(pEditor);
	*pImg = ImgInfo;
	pImg->m_Texture = pEditor->Graphics()->LoadTextureRaw(ImgInfo.m_Width, ImgInfo.m_Height, ImgInfo.m_Format, ImgInfo.m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
	ImgInfo.m_pData = 0;
	pImg->m_External = 1;	// external by default
	str_copy(pImg->m_aName, aBuf, sizeof(pImg->m_aName));
	pImg->LoadAutoMapper();
	pEditor->m_Map.m_lImages.add(pImg);
	pEditor->SortImages();
	if(pEditor->m_SelectedImage > -1 && pEditor->m_SelectedImage < pEditor->m_Map.m_lImages.size())
	{
		for(int i = 0; i <= pEditor->m_SelectedImage; ++i)
			if(!str_comp(pEditor->m_Map.m_lImages[i]->m_aName, aBuf))
			{
				pEditor->m_SelectedImage++;
				break;
			}
	}
	pEditor->m_Dialog = DIALOG_NONE;
}